

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

void pospopcnt_u8_sse_horizreduce(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  int j;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  if ((len & 0xffffffffffffffc0) == 0) {
    auVar9 = (undefined1  [16])0x0;
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar8 = (undefined1  [16])0x0;
    auVar13 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar7 = (undefined1  [16])0x0;
    auVar4 = (undefined1  [16])0x0;
    auVar6 = (undefined1  [16])0x0;
    auVar5 = (undefined1  [16])0x0;
  }
  else {
    pauVar1 = (undefined1 (*) [16])(data + (len & 0xffffffffffffffc0));
    auVar26._8_4_ = 0x55555555;
    auVar26._0_8_ = 0x5555555555555555;
    auVar26._12_4_ = 0x55555555;
    auVar27._8_4_ = 0x33333333;
    auVar27._0_8_ = 0x3333333333333333;
    auVar27._12_4_ = 0x33333333;
    auVar28[8] = 7;
    auVar28._0_8_ = 0x707070707070707;
    auVar28[9] = 7;
    auVar28[10] = 7;
    auVar28[0xb] = 7;
    auVar28[0xc] = 7;
    auVar28[0xd] = 7;
    auVar28[0xe] = 7;
    auVar28[0xf] = 7;
    auVar29[8] = 0x70;
    auVar29._0_8_ = 0x7070707070707070;
    auVar29[9] = 0x70;
    auVar29[10] = 0x70;
    auVar29[0xb] = 0x70;
    auVar29[0xc] = 0x70;
    auVar29[0xd] = 0x70;
    auVar29[0xe] = 0x70;
    auVar29[0xf] = 0x70;
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar25 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar4 = vmovdqu64_avx512vl(*(undefined1 (*) [16])((long)data + 0x30));
      auVar5 = vpandd_avx512vl(*(undefined1 (*) [16])data,auVar26);
      auVar6 = vpandd_avx512vl(*(undefined1 (*) [16])((long)data + 0x10),auVar26);
      auVar7 = vpaddd_avx512vl(auVar6,auVar5);
      auVar5 = vpsrld_avx(*(undefined1 (*) [16])data,1);
      auVar6 = vpsrld_avx(*(undefined1 (*) [16])((long)data + 0x10),1);
      auVar5 = vpand_avx(auVar5,auVar26);
      auVar6 = vpand_avx(auVar6,auVar26);
      auVar5 = vpaddd_avx(auVar6,auVar5);
      auVar6 = vpand_avx(*(undefined1 (*) [16])((long)data + 0x20),auVar26);
      auVar8 = vpandd_avx512vl(auVar4,auVar26);
      auVar8 = vpaddd_avx512vl(auVar8,auVar6);
      auVar6 = vpsrld_avx(*(undefined1 (*) [16])((long)data + 0x20),1);
      auVar4 = vpsrld_avx512vl(auVar4,1);
      auVar6 = vpand_avx(auVar6,auVar26);
      auVar4 = vpandd_avx512vl(auVar4,auVar26);
      auVar4 = vpaddd_avx512vl(auVar4,auVar6);
      auVar6 = vpandd_avx512vl(auVar7,auVar27);
      auVar9 = vpandd_avx512vl(auVar8,auVar27);
      auVar10 = vpaddd_avx512vl(auVar9,auVar6);
      auVar6 = vpandd_avx512vl(auVar5,auVar27);
      auVar9 = vpandd_avx512vl(auVar4,auVar27);
      auVar11 = vpaddd_avx512vl(auVar9,auVar6);
      auVar6 = vpsrld_avx512vl(auVar7,2);
      auVar8 = vpsrld_avx(auVar8,2);
      auVar7 = vpandd_avx512vl(auVar6,auVar27);
      auVar6 = vpand_avx(auVar8,auVar27);
      auVar12 = vpaddd_avx512vl(auVar6,auVar7);
      auVar5 = vpsrld_avx(auVar5,2);
      auVar6 = vpsrld_avx(auVar4,2);
      auVar5 = vpand_avx(auVar5,auVar27);
      auVar6 = vpand_avx(auVar6,auVar27);
      auVar9 = vpaddd_avx(auVar6,auVar5);
      auVar5 = vpandq_avx512vl(auVar10,auVar28);
      auVar5 = vpsadbw_avx(auVar5,(undefined1  [16])0x0);
      auVar5 = vpaddq_avx(auVar5,auVar18._0_16_);
      auVar18 = ZEXT1664(auVar5);
      auVar6 = vpandq_avx512vl(auVar10,auVar29);
      auVar6 = vpsadbw_avx(auVar6,(undefined1  [16])0x0);
      auVar6 = vpaddq_avx(auVar6,auVar23._0_16_);
      auVar23 = ZEXT1664(auVar6);
      auVar4 = vpandq_avx512vl(auVar11,auVar28);
      auVar4 = vpsadbw_avx(auVar4,(undefined1  [16])0x0);
      auVar4 = vpaddq_avx(auVar4,auVar19._0_16_);
      auVar19 = ZEXT1664(auVar4);
      auVar7 = vpandq_avx512vl(auVar11,auVar29);
      auVar7 = vpsadbw_avx(auVar7,(undefined1  [16])0x0);
      auVar7 = vpaddq_avx(auVar7,auVar25._0_16_);
      auVar25 = ZEXT1664(auVar7);
      auVar8 = vpand_avx(auVar12,auVar28);
      auVar8 = vpsadbw_avx(auVar8,(undefined1  [16])0x0);
      auVar8 = vpaddq_avx(auVar8,auVar17._0_16_);
      auVar17 = ZEXT1664(auVar8);
      auVar13 = ZEXT1632(auVar8);
      auVar8 = vpand_avx(auVar12,auVar29);
      auVar8 = vpsadbw_avx(auVar8,(undefined1  [16])0x0);
      auVar8 = vpaddq_avx(auVar8,auVar22._0_16_);
      auVar22 = ZEXT1664(auVar8);
      auVar10 = vpand_avx(auVar9,auVar28);
      auVar10 = vpsadbw_avx(auVar10,(undefined1  [16])0x0);
      auVar10 = vpaddq_avx(auVar10,auVar16._0_16_);
      auVar16 = ZEXT1664(auVar10);
      auVar9 = vpand_avx(auVar9,auVar29);
      auVar9 = vpsadbw_avx(auVar9,(undefined1  [16])0x0);
      auVar9 = vpaddq_avx(auVar9,auVar20._0_16_);
      auVar20 = ZEXT1664(auVar9);
      data = (uint8_t *)((long)data + 0x40);
    } while ((undefined1 (*) [16])data != pauVar1);
  }
  auVar26 = vpunpcklqdq_avx(auVar6,auVar7);
  auVar6 = vpunpckhqdq_avx(auVar6,auVar7);
  auVar6 = vpaddq_avx(auVar26,auVar6);
  auVar26 = vpunpcklqdq_avx(auVar8,auVar9);
  auVar7 = vpunpckhqdq_avx(auVar8,auVar9);
  auVar7 = vpaddq_avx(auVar26,auVar7);
  auVar8 = vpunpcklqdq_avx(auVar5,auVar4);
  auVar21._0_16_ = ZEXT116(0) * auVar13._0_16_ + ZEXT116(1) * auVar8;
  auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13._0_16_;
  uVar14 = auVar16._0_8_;
  auVar24._8_8_ = uVar14;
  auVar24._0_8_ = uVar14;
  auVar24._16_8_ = uVar14;
  auVar24._24_8_ = uVar14;
  auVar21 = vpblendd_avx2(auVar21,auVar24,0xc0);
  auVar17 = vinserti32x4_avx512f(auVar16,auVar6,2);
  auVar17 = vinserti32x4_avx512f(auVar17,auVar7,3);
  auVar5 = vpunpckhqdq_avx(auVar5,auVar4);
  auVar13 = vpermq_avx2(auVar13,0x55);
  auVar13 = vpblendd_avx2(ZEXT1632(auVar5),auVar13,0xf0);
  auVar5 = auVar16._0_16_;
  auVar15._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar5;
  auVar15._16_16_ = ZEXT116(0) * auVar16._16_16_ + ZEXT116(1) * auVar5;
  auVar13 = vpblendd_avx2(auVar13,auVar15,0xc0);
  auVar13 = vpaddq_avx2(auVar21,auVar13);
  auVar16 = vpsrlq_avx512f(auVar17,4);
  auVar16 = vinserti64x4_avx512f(auVar16,auVar13,0);
  auVar13 = vpmovqd_avx512f(auVar16);
  auVar13 = vpaddd_avx2(auVar13,*(undefined1 (*) [32])flag_counts);
  *(undefined1 (*) [32])flag_counts = auVar13;
  if ((len & 0x3f) != 0) {
    uVar2 = 0;
    do {
      lVar3 = 0;
      do {
        flag_counts[lVar3] =
             flag_counts[lVar3] +
             (uint)(((byte)(*(undefined1 (*) [16])data)[uVar2] >> ((uint)lVar3 & 0x1f) & 1) != 0);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (len & 0x3f));
  }
  return;
}

Assistant:

void pospopcnt_u8_sse_horizreduce(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();

    __m128i counter_a = zero;
    __m128i counter_b = zero;
    __m128i counter_c = zero;
    __m128i counter_d = zero;
    __m128i counter_e = zero;
    __m128i counter_f = zero;
    __m128i counter_g = zero;
    __m128i counter_h = zero;

    for (const uint8_t* end = &data[(len & ~63)]; data != end; data += 64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m128i r0 = _mm_loadu_si128((__m128i*)&data[0*16]);
        const __m128i r1 = _mm_loadu_si128((__m128i*)&data[1*16]);
        const __m128i r2 = _mm_loadu_si128((__m128i*)&data[2*16]);
        const __m128i r3 = _mm_loadu_si128((__m128i*)&data[3*16]);

        // s0 = [a0+a1|c0+c1|e0+e1|g0+g1]
        // s1 = [b0+b1|d0+d1|f0+f1|h0+h1]
        // s2 = [a2+a3|c2+c3|e2+e3|g2+g3]
        // s3 = [b2+b3|d2+d3|f2+f3|h2+h3]
        const __m128i s0 = sse4_add1_even(r0, r1);
        const __m128i s1 = sse4_add1_odd (r0, r1);
        const __m128i s2 = sse4_add1_even(r2, r3);
        const __m128i s3 = sse4_add1_odd (r2, r3);

        // d0 = [a0+a1+a2+a3|e0+e1+e2+e3]
        // d1 = [b0+b1+b2+b3|f0+f1+f2+f3]
        // d2 = [c0+c1+c2+c3|g0+g1+g2+g3]
        // d3 = [d0+d1+d2+d3|h0+h1+h2+h3]
        const __m128i d0 = sse4_add2_even(s0, s2);
        const __m128i d1 = sse4_add2_even(s1, s3);
        const __m128i d2 = sse4_add2_odd (s0, s2);
        const __m128i d3 = sse4_add2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m128i mask_lo = _mm_set1_epi8(0x0f);
        const __m128i mask_hi = _mm_set1_epi8(0xf0);
        // Note: counter for higher nibble have to be divided by 16
        const __m128i sum0 = _mm_sad_epu8(d0 & mask_lo, zero);
        const __m128i sum1 = _mm_sad_epu8(d0 & mask_hi, zero);
        const __m128i sum2 = _mm_sad_epu8(d1 & mask_lo, zero);
        const __m128i sum3 = _mm_sad_epu8(d1 & mask_hi, zero);
        const __m128i sum4 = _mm_sad_epu8(d2 & mask_lo, zero);
        const __m128i sum5 = _mm_sad_epu8(d2 & mask_hi, zero);
        const __m128i sum6 = _mm_sad_epu8(d3 & mask_lo, zero);
        const __m128i sum7 = _mm_sad_epu8(d3 & mask_hi, zero);

        counter_a = _mm_add_epi64(counter_a, sum0);
        counter_b = _mm_add_epi64(counter_b, sum1);
        counter_c = _mm_add_epi64(counter_c, sum2);
        counter_d = _mm_add_epi64(counter_d, sum3);
        counter_e = _mm_add_epi64(counter_e, sum4);
        counter_f = _mm_add_epi64(counter_f, sum5);
        counter_g = _mm_add_epi64(counter_g, sum6);
        counter_h = _mm_add_epi64(counter_h, sum7);
    }

    flag_counts[0] += sse4_sum_epu64(counter_a);
    flag_counts[1] += sse4_sum_epu64(counter_c);
    flag_counts[2] += sse4_sum_epu64(counter_e);
    flag_counts[3] += sse4_sum_epu64(counter_g);
    flag_counts[4] += sse4_sum_epu64(counter_b) >> 4;
    flag_counts[5] += sse4_sum_epu64(counter_d) >> 4;
    flag_counts[6] += sse4_sum_epu64(counter_f) >> 4;
    flag_counts[7] += sse4_sum_epu64(counter_h) >> 4;

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 64, flag_counts);
}